

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testJacobiEigenSolver<Imath_3_2::Matrix44<float>>(Matrix44<float> *A)

{
  uint i;
  long lVar1;
  float *pfVar2;
  uint i_1;
  float (*pafVar3) [4];
  uint j;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Matrix44<float> V;
  Matrix44<float> MS;
  TV S;
  float local_254;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240;
  undefined8 local_23c;
  undefined8 uStack_234;
  float local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float local_214;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200;
  undefined8 local_1fc;
  undefined8 uStack_1f4;
  float local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Vec4 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  fVar5 = 0.0;
  lVar1 = 0;
  pafVar3 = (float (*) [4])A;
  do {
    lVar4 = 0;
    fVar11 = fVar5;
    do {
      fVar5 = ABS((*(float (*) [4])*pafVar3)[lVar4]);
      if (fVar5 <= fVar11) {
        fVar5 = fVar11;
      }
      lVar4 = lVar4 + 1;
      fVar11 = fVar5;
    } while (lVar4 != 4);
    lVar1 = lVar1 + 1;
    pafVar3 = pafVar3 + 1;
  } while (lVar1 != 4);
  fVar11 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar5) {
    fVar11 = fVar5;
  }
  fVar11 = fVar11 * 100.0 * 1.1920929e-07;
  local_58 = *(undefined8 *)A->x[0];
  uStack_50 = *(undefined8 *)(A->x[0] + 2);
  local_48 = *(undefined8 *)A->x[1];
  uStack_40 = *(undefined8 *)(A->x[1] + 2);
  local_38 = *(undefined8 *)A->x[2];
  uStack_30 = *(undefined8 *)(A->x[2] + 2);
  local_28 = *(undefined8 *)A->x[3];
  uStack_20 = *(undefined8 *)(A->x[3] + 2);
  local_254 = 1.0;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 1.0;
  local_23c = 0;
  uStack_234 = 0;
  local_22c = 1.0;
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 1.0;
  Imath_3_2::jacobiEigenSolver<float>
            ((Matrix44 *)&local_58,local_a8,(Matrix44 *)&local_254,1.1920929e-07);
  verifyOrthonormal<Imath_3_2::Matrix44<float>>((Matrix44<float> *)&local_254,fVar11);
  fVar5 = 0.0;
  if (((float)uStack_248 != 0.0) || (NAN((float)uStack_248))) {
    fVar5 = 0.0 - (float)uStack_248 *
                  (((float)uStack_234 * (float)uStack_220 - local_228._4_4_ * uStack_234._4_4_) *
                   (float)local_23c +
                  (uStack_234._4_4_ * uStack_220._4_4_ - (float)uStack_220 * local_22c) *
                  uStack_248._4_4_ +
                  (local_22c * local_228._4_4_ - uStack_220._4_4_ * (float)uStack_234) * local_240);
  }
  if ((local_23c._4_4_ != 0.0) || (NAN(local_23c._4_4_))) {
    fVar5 = fVar5 + local_23c._4_4_ *
                    (((float)uStack_234 * (float)uStack_220 - local_228._4_4_ * uStack_234._4_4_) *
                     local_250._4_4_ +
                    (uStack_234._4_4_ * uStack_220._4_4_ - (float)uStack_220 * local_22c) *
                    local_254 +
                    (local_22c * local_228._4_4_ - uStack_220._4_4_ * (float)uStack_234) *
                    (float)local_250);
  }
  if (((float)local_228 != 0.0) || (NAN((float)local_228))) {
    fVar5 = fVar5 - (float)local_228 *
                    ((uStack_248._4_4_ * (float)uStack_220 - local_228._4_4_ * local_240) *
                     local_250._4_4_ +
                    (local_240 * uStack_220._4_4_ - (float)uStack_220 * (float)local_23c) *
                    local_254 +
                    ((float)local_23c * local_228._4_4_ - uStack_220._4_4_ * uStack_248._4_4_) *
                    (float)local_250);
  }
  if ((local_218 != 0.0) || (NAN(local_218))) {
    fVar5 = fVar5 + local_218 *
                    ((uStack_248._4_4_ * uStack_234._4_4_ - (float)uStack_234 * local_240) *
                     local_250._4_4_ +
                    (local_240 * local_22c - uStack_234._4_4_ * (float)local_23c) * local_254 +
                    ((float)local_23c * (float)uStack_234 - local_22c * uStack_248._4_4_) *
                    (float)local_250);
  }
  if (fVar11 <= ABS(fVar5) + -1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
  }
  pfVar2 = &local_214;
  local_214 = 1.0;
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 1.0;
  local_1fc = 0;
  uStack_1f4 = 0;
  local_1ec = 1.0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1d8 = 1.0;
  lVar1 = 0;
  do {
    lVar4 = 0;
    do {
      fVar5 = 0.0;
      if (lVar1 == lVar4) {
        fVar5 = *(float *)(local_a8 + lVar1 * 4);
      }
      pfVar2[lVar4] = fVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 4;
  } while (lVar1 != 4);
  fVar5 = Imath_3_2::Matrix44<float>::determinant(A);
  fVar6 = 0.0;
  if (((float)uStack_208 != 0.0) || (NAN((float)uStack_208))) {
    fVar6 = 0.0 - (((float)uStack_1f4 * (float)uStack_1e0 - local_1e8._4_4_ * uStack_1f4._4_4_) *
                   (float)local_1fc +
                  (uStack_1f4._4_4_ * uStack_1e0._4_4_ - (float)uStack_1e0 * local_1ec) *
                  uStack_208._4_4_ +
                  (local_1ec * local_1e8._4_4_ - uStack_1e0._4_4_ * (float)uStack_1f4) * local_200)
                  * (float)uStack_208;
  }
  if ((local_1fc._4_4_ != 0.0) || (NAN(local_1fc._4_4_))) {
    fVar6 = fVar6 + (((float)uStack_1f4 * (float)uStack_1e0 - local_1e8._4_4_ * uStack_1f4._4_4_) *
                     local_210._4_4_ +
                    (uStack_1f4._4_4_ * uStack_1e0._4_4_ - (float)uStack_1e0 * local_1ec) *
                    local_214 +
                    (local_1ec * local_1e8._4_4_ - uStack_1e0._4_4_ * (float)uStack_1f4) *
                    (float)local_210) * local_1fc._4_4_;
  }
  if (((float)local_1e8 != 0.0) || (NAN((float)local_1e8))) {
    fVar6 = fVar6 - ((uStack_208._4_4_ * (float)uStack_1e0 - local_1e8._4_4_ * local_200) *
                     local_210._4_4_ +
                    (local_200 * uStack_1e0._4_4_ - (float)uStack_1e0 * (float)local_1fc) *
                    local_214 +
                    ((float)local_1fc * local_1e8._4_4_ - uStack_1e0._4_4_ * uStack_208._4_4_) *
                    (float)local_210) * (float)local_1e8;
  }
  local_1a8 = ZEXT416((uint)local_1d8);
  if ((local_1d8 != 0.0) || (NAN(local_1d8))) {
    fVar6 = fVar6 + ((uStack_208._4_4_ * uStack_1f4._4_4_ - (float)uStack_1f4 * local_200) *
                     local_210._4_4_ +
                    (local_200 * local_1ec - uStack_1f4._4_4_ * (float)local_1fc) * local_214 +
                    ((float)local_1fc * (float)uStack_1f4 - local_1ec * uStack_208._4_4_) *
                    (float)local_210) * local_1d8;
  }
  if (ABS(fVar5) - ABS(fVar6) < fVar11) {
    local_1c4 = uStack_208._4_4_;
    fVar14 = (float)uStack_248 * local_1e8._4_4_ +
             local_250._4_4_ * (float)uStack_1f4 +
             local_254 * local_214 + (float)local_250 * uStack_208._4_4_;
    local_b8 = ZEXT416((uint)fVar14);
    local_1c8 = local_200;
    local_1cc = (float)local_210;
    local_168 = ZEXT416((uint)(float)uStack_1e0);
    fVar5 = (float)uStack_248 * (float)uStack_1e0 +
            local_250._4_4_ * uStack_1f4._4_4_ +
            local_254 * (float)local_210 + (float)local_250 * local_200;
    local_c8 = ZEXT416((uint)fVar5);
    local_f8 = ZEXT416((uint)(float)local_250);
    local_1d4 = local_210._4_4_;
    local_1d0 = local_1ec;
    fVar15 = (float)uStack_248 * uStack_1e0._4_4_ +
             local_250._4_4_ * local_1ec +
             local_254 * local_210._4_4_ + (float)local_250 * (float)local_1fc;
    local_d8 = ZEXT416((uint)fVar15);
    fVar6 = (float)uStack_248 * local_1d8 +
            local_250._4_4_ * (float)local_1e8 +
            local_254 * (float)uStack_208 + local_1fc._4_4_ * (float)local_250;
    local_e8 = ZEXT416((uint)fVar6);
    fVar7 = local_23c._4_4_ * local_1e8._4_4_ +
            (float)local_23c * (float)uStack_1f4 +
            uStack_248._4_4_ * local_214 + uStack_208._4_4_ * local_240;
    local_108 = ZEXT416((uint)fVar7);
    fVar8 = local_23c._4_4_ * (float)uStack_1e0 +
            (float)local_23c * uStack_1f4._4_4_ +
            uStack_248._4_4_ * (float)local_210 + local_200 * local_240;
    local_118 = ZEXT416((uint)fVar8);
    local_1c0 = (float)local_1fc;
    local_148 = ZEXT416((uint)local_240);
    fVar9 = local_23c._4_4_ * uStack_1e0._4_4_ +
            (float)local_23c * local_1ec +
            uStack_248._4_4_ * local_210._4_4_ + (float)local_1fc * local_240;
    local_128 = ZEXT416((uint)fVar9);
    local_138 = CONCAT44(uStack_248._4_4_,local_254);
    uStack_130 = 0;
    local_188._4_4_ = (float)local_23c;
    local_188._0_4_ = local_250._4_4_;
    local_188._8_8_ = 0;
    local_178._4_4_ = local_23c._4_4_;
    local_178._0_4_ = (float)uStack_248;
    local_178._8_8_ = 0;
    fVar12 = local_23c._4_4_ * local_1d8 +
             (float)local_23c * (float)local_1e8 +
             uStack_248._4_4_ * (float)uStack_208 + local_1fc._4_4_ * local_240;
    local_1bc = local_214;
    fVar20 = (float)local_228 * local_1e8._4_4_ +
             local_22c * (float)uStack_1f4 +
             (float)uStack_234 * local_214 + uStack_208._4_4_ * uStack_234._4_4_;
    fVar10 = (float)local_228 * (float)uStack_1e0 +
             local_22c * uStack_1f4._4_4_ +
             (float)uStack_234 * (float)local_210 + local_200 * uStack_234._4_4_;
    local_158 = ZEXT416((uint)fVar10);
    fVar21 = (float)local_228 * uStack_1e0._4_4_ +
             local_22c * local_1ec +
             (float)uStack_234 * local_210._4_4_ + (float)local_1fc * uStack_234._4_4_;
    fVar13 = (float)local_228 * local_1d8 +
             local_22c * (float)local_1e8 +
             (float)uStack_234 * (float)uStack_208 + local_1fc._4_4_ * uStack_234._4_4_;
    fVar18 = local_1e8._4_4_ * local_218 +
             (float)uStack_1f4 * uStack_220._4_4_ +
             local_214 * local_228._4_4_ + uStack_208._4_4_ * (float)uStack_220;
    local_198 = ZEXT416((uint)fVar18);
    fVar19 = (float)uStack_1e0 * local_218 +
             uStack_1f4._4_4_ * uStack_220._4_4_ +
             (float)local_210 * local_228._4_4_ + local_200 * (float)uStack_220;
    fVar17 = uStack_1e0._4_4_ * local_218 +
             local_1ec * uStack_220._4_4_ +
             local_210._4_4_ * local_228._4_4_ + (float)local_1fc * (float)uStack_220;
    local_1b8 = ZEXT416((uint)fVar17);
    fVar16 = local_1d8 * local_218 +
             (float)local_1e8 * uStack_220._4_4_ +
             (float)uStack_208 * local_228._4_4_ + local_1fc._4_4_ * (float)uStack_220;
    pfVar2 = &local_98;
    local_98 = fVar6 * (float)uStack_248 +
               fVar15 * local_250._4_4_ + fVar14 * local_254 + fVar5 * (float)local_250;
    fStack_94 = fVar6 * local_23c._4_4_ +
                fVar15 * (float)local_23c + fVar14 * uStack_248._4_4_ + fVar5 * local_240;
    fStack_90 = fVar6 * (float)local_228 +
                fVar15 * local_22c + fVar14 * (float)uStack_234 + fVar5 * uStack_234._4_4_;
    fStack_8c = fVar6 * local_218 +
                fVar15 * uStack_220._4_4_ + fVar14 * local_228._4_4_ + fVar5 * (float)uStack_220;
    local_88 = fVar12 * (float)uStack_248 +
               fVar9 * local_250._4_4_ + fVar7 * local_254 + fVar8 * (float)local_250;
    fStack_84 = fVar12 * local_23c._4_4_ +
                fVar9 * (float)local_23c + fVar7 * uStack_248._4_4_ + fVar8 * local_240;
    fStack_80 = fVar12 * (float)local_228 +
                fVar9 * local_22c + fVar7 * (float)uStack_234 + fVar8 * uStack_234._4_4_;
    fStack_7c = fVar12 * local_218 +
                fVar9 * uStack_220._4_4_ + fVar7 * local_228._4_4_ + fVar8 * (float)uStack_220;
    local_78 = fVar13 * (float)uStack_248 +
               fVar21 * local_250._4_4_ + fVar20 * local_254 + fVar10 * (float)local_250;
    fStack_74 = fVar13 * local_23c._4_4_ +
                fVar21 * (float)local_23c + fVar20 * uStack_248._4_4_ + fVar10 * local_240;
    fStack_70 = fVar13 * (float)local_228 +
                fVar21 * local_22c + fVar20 * (float)uStack_234 + fVar10 * uStack_234._4_4_;
    fStack_6c = fVar13 * local_218 +
                fVar21 * uStack_220._4_4_ + fVar20 * local_228._4_4_ + fVar10 * (float)uStack_220;
    local_68 = fVar16 * (float)uStack_248 +
               fVar17 * local_250._4_4_ + fVar18 * local_254 + fVar19 * (float)local_250;
    fStack_64 = fVar16 * local_23c._4_4_ +
                fVar17 * (float)local_23c + fVar18 * uStack_248._4_4_ + fVar19 * local_240;
    fStack_60 = fVar16 * (float)local_228 +
                fVar17 * local_22c + fVar18 * (float)uStack_234 + fVar19 * uStack_234._4_4_;
    fStack_5c = fVar16 * local_218 +
                fVar17 * uStack_220._4_4_ + fVar18 * local_228._4_4_ + fVar19 * (float)uStack_220;
    lVar1 = 0;
    do {
      lVar4 = 0;
      do {
        if (fVar11 <= ABS((*(float (*) [4])*(float (*) [4])A)[lVar4] - pfVar2[lVar4])) {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      lVar1 = lVar1 + 1;
      A = (Matrix44<float> *)((long)A + 0x10);
      pfVar2 = pfVar2 + 4;
    } while (lVar1 != 4);
    return;
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}